

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimaxtest2.c
# Opt level: O2

int main(void)

{
  int iVar1;
  double *amse;
  FILE *__stream;
  double *inp;
  sarimax_object obj;
  long lVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dStack_25b8;
  double temp [1200];
  
  temp[0x4af] = (double)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  if (__stream != (FILE *)0x0) {
    uVar3 = 0;
    lVar2 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",(long)temp + (uVar3 - 8));
      lVar2 = lVar2 + 1;
      uVar3 = uVar3 + 8;
    }
    inp = (double *)malloc(uVar3 & 0x7fffffff8);
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      dVar5 = log(temp[lVar4 + -1]);
      inp[lVar4] = dVar5;
    }
    obj = sarimax_init(2,1,2,1,1,1,0xc,0,1,(int)lVar2);
    sarimax_setMethod(obj,2);
    sarimax_exec(obj,inp,(double *)0x0);
    sarimax_summary(obj);
    sarimax_predict(obj,inp,(double *)0x0,5,(double *)0x0,(double *)temp[0x4af],amse);
    putchar(10);
    printf("Predicted Values : ");
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      exp(*(double *)((long)temp[0x4af] + lVar2 * 8));
      printf("%g ");
    }
    putchar(10);
    printf("Standard Errors  : ");
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      dVar5 = amse[lVar2];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      printf("%g ",dVar5);
    }
    putchar(10);
    sarimax_free(obj);
    free(inp);
    free((void *)temp[0x4af]);
    free(amse);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *phi, *theta;
    double *PHI, *THETA;
	double *xpred, *amse;
	sarimax_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 1;
	q = 2;
	s = 12;
	P = 1;
	D = 1;
	Q = 1;
	r = 0;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
    PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = log(temp[i]);
	}


	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	sarimax_setMethod(obj, 2); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	sarimax_exec(obj, inp,NULL);
	sarimax_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */
	sarimax_predict(obj, inp, NULL, L, NULL, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", exp(xpred[i]));
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarimax_free(obj);
	free(inp);
	free(phi);
	free(theta);
    free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
	return 0;

}